

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O2

void __thiscall
dap::ResponseOrError<dap::StackTraceResponse>::~ResponseOrError
          (ResponseOrError<dap::StackTraceResponse> *this)

{
  std::__cxx11::string::~string((string *)&this->error);
  std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>::~vector
            ((vector<dap::StackFrame,_std::allocator<dap::StackFrame>_> *)this);
  return;
}

Assistant:

inline ResponseOrError() = default;